

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool ReadASC(string *ASCPath,VecVector3d *Accel,VecVector3d *Gyro)

{
  pointer *ppMVar1;
  iterator iVar2;
  uint uVar3;
  char cVar4;
  istream *piVar5;
  double *pdVar6;
  ostream *poVar7;
  long lVar8;
  int week;
  string line;
  Vector3d accel;
  int status;
  Vector3d gyro;
  string head;
  double SOW;
  ifstream ASCFile;
  stringstream buff;
  int local_44c;
  char *local_448;
  long local_440;
  char local_438 [16];
  Matrix<double,_3,_1,_0,_3,_1> local_428;
  uint local_410;
  int local_40c;
  Matrix<double,_3,_1,_0,_3,_1> local_408;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8 [16];
  double local_3c8;
  long local_3c0 [4];
  uint auStack_3a0 [122];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::ifstream::ifstream((string *)local_3c0);
  std::ifstream::open((string *)local_3c0,(_Ios_Openmode)ASCPath);
  local_410 = *(uint *)((long)auStack_3a0 + *(long *)(local_3c0[0] + -0x18));
  if ((local_410 & 5) == 0) {
    if ((*(byte *)((long)auStack_3a0 + *(long *)(local_3c0[0] + -0x18)) & 2) == 0) {
      do {
        local_448 = local_438;
        local_440 = 0;
        local_438[0] = '\0';
        std::__cxx11::stringstream::stringstream(local_1b8);
        cVar4 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) +
                                (char)(string *)local_3c0);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_448,cVar4);
        if (local_440 != 0) {
          lVar8 = 0;
          do {
            if (local_448[lVar8] == ',') {
              local_448[lVar8] = ' ';
            }
            lVar8 = lVar8 + 1;
          } while (local_440 != lVar8);
        }
        if (local_440 != 0) {
          lVar8 = 0;
          do {
            if (local_448[lVar8] == ';') {
              local_448[lVar8] = ' ';
            }
            lVar8 = lVar8 + 1;
          } while (local_440 != lVar8);
        }
        if (local_440 != 0) {
          lVar8 = 0;
          do {
            if (local_448[lVar8] == '*') {
              local_448[lVar8] = ' ';
            }
            lVar8 = lVar8 + 1;
          } while (local_440 != lVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_448,local_440);
        local_3e8 = local_3d8;
        local_3e0 = 0;
        local_3d8[0] = 0;
        piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_3e8);
        pdVar6 = (double *)std::istream::operator>>(piVar5,&local_44c);
        piVar5 = std::istream::_M_extract<double>(pdVar6);
        pdVar6 = (double *)std::istream::operator>>(piVar5,&local_44c);
        piVar5 = std::istream::_M_extract<double>(pdVar6);
        pdVar6 = (double *)std::istream::operator>>(piVar5,&local_40c);
        piVar5 = std::istream::_M_extract<double>(pdVar6);
        piVar5 = std::istream::_M_extract<double>((double *)piVar5);
        piVar5 = std::istream::_M_extract<double>((double *)piVar5);
        piVar5 = std::istream::_M_extract<double>((double *)piVar5);
        piVar5 = std::istream::_M_extract<double>((double *)piVar5);
        std::istream::_M_extract<double>((double *)piVar5);
        local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = -local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[1];
        if (local_40c != 0x4d) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"observations are not operable!\n",0x1f);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time: ",6);
          poVar7 = (ostream *)std::ostream::operator<<(&std::cout,local_44c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::ostream::_M_insert<double>(local_3c8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] * 1.52587890625e-06;
        local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] * 1.52587890625e-06;
        local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] * 1.52587890625e-06;
        local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] * 1.0850694444444445e-07;
        local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] * 1.0850694444444445e-07;
        local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] * 1.0850694444444445e-07;
        iVar2._M_current =
             (Accel->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (Accel->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)Accel,iVar2,&local_428);
        }
        else {
          ((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          ((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          ((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          ppMVar1 = &(Accel->
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        iVar2._M_current =
             (Gyro->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (Gyro->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)Gyro,iVar2,&local_408);
        }
        else {
          ((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          ((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          ((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          ppMVar1 = &(Gyro->
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        if (local_3e8 != local_3d8) {
          operator_delete(local_3e8);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_448 != local_438) {
          operator_delete(local_448);
        }
      } while ((*(byte *)((long)auStack_3a0 + *(long *)(local_3c0[0] + -0x18)) & 2) == 0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"open error!",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
  }
  uVar3 = local_410 & 5;
  std::ifstream::~ifstream(local_3c0);
  return uVar3 == 0;
}

Assistant:

bool ReadASC(string ASCPath, VecVector3d &Accel, VecVector3d &Gyro)
{
    ifstream ASCFile;
    ASCFile.open(ASCPath);
    if(!ASCFile)
    {
        cerr << "open error!" << endl;
        return false;
    }

    while(!ASCFile.eof())
    {
        /* 去标点处理 */
        string line;
        stringstream buff;
        getline(ASCFile, line);
        replace(line.begin(), line.end(), ',', ' ');
        replace(line.begin(), line.end(), ';', ' ');
        replace(line.begin(), line.end(), '*', ' ');
        buff << line;

        /* 数据存入内存 */
        Vector3d gyro, accel;
        /* 本次实验暂时未使用 */
        int week, status;
        double SOW;
        string head;
        buff >> head >> week >> SOW >> week >> SOW >> status >> accel[2] >> accel[1] >> accel[0]
             >> gyro[2] >> gyro[1] >> gyro[0];
        /* Y轴的输出是加了一个负号 */
        accel[1] = -accel[1];
        
        if(status != 77)
            cout << "observations are not operable!\n" << "time: " << week << ", " << SOW << endl;
            
        accel *= ACCEL_SCALE;
        gyro *= GYRO_SCALE;
        Accel.push_back(accel);
        Gyro.push_back(gyro);
    }
    
    return true;
}